

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutput.cpp
# Opt level: O0

void __thiscall TestOutput::printFileAndLineForTestAndFailure(TestOutput *this,TestFailure *failure)

{
  int iVar1;
  TestOutput *in_RSI;
  SimpleString *in_RDI;
  undefined4 in_stack_ffffffffffffffc0;
  undefined1 local_38 [28];
  int in_stack_ffffffffffffffe4;
  SimpleString *in_stack_ffffffffffffffe8;
  
  (*in_RSI->_vptr_TestOutput[7])(&stack0xffffffffffffffe8);
  iVar1 = (*in_RSI->_vptr_TestOutput[8])();
  printErrorInFileOnLineFormattedForWorkingEnvironment
            (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
  SimpleString::~SimpleString((SimpleString *)0x213bfe);
  (*in_RSI->_vptr_TestOutput[3])();
  printFailureInTest((TestOutput *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),in_RDI);
  SimpleString::~SimpleString((SimpleString *)0x213c31);
  (*in_RSI->_vptr_TestOutput[2])(local_38);
  (*in_RSI->_vptr_TestOutput[5])();
  printErrorInFileOnLineFormattedForWorkingEnvironment
            (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
  SimpleString::~SimpleString((SimpleString *)0x213c77);
  return;
}

Assistant:

void TestOutput::printFileAndLineForTestAndFailure(const TestFailure& failure)
{
    printErrorInFileOnLineFormattedForWorkingEnvironment(failure.getTestFileName(), failure.getTestLineNumber());
    printFailureInTest(failure.getTestName());
    printErrorInFileOnLineFormattedForWorkingEnvironment(failure.getFileName(), failure.getFailureLineNumber());
}